

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O2

void icetStateSetDefaults(void)

{
  uint value;
  int iVar1;
  IceTInt *pIVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  icetDiagnostics(0x103);
  uVar4 = 0;
  value = icetCommSize();
  iVar1 = icetCommRank();
  icetStateSetInteger(2,iVar1);
  icetStateSetInteger(3,value);
  icetStateSetFloatv(5,4,black);
  icetStateSetInteger(6,0);
  icetStateSetInteger(9,0xc001);
  icetStateSetInteger(10,0xd001);
  icetResetTiles();
  icetStateSetIntegerv(0x1a,0,(IceTInt *)0x0);
  icetStateSetDoublev(0x22,0,(IceTDouble *)0x0);
  icetStateSetInteger(0x23,0);
  icetStateSetInteger(0x24,-1);
  icetSingleImageStrategy(0x7001);
  icetCompositeMode(0x301);
  pIVar2 = icetStateAllocateInteger(0x29,value);
  uVar5 = 0;
  if (0 < (int)value) {
    uVar5 = (ulong)value;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pIVar2[uVar4] = (IceTInt)uVar4;
  }
  pIVar2 = icetStateAllocateInteger(0x2a,value);
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    pIVar2[uVar4] = (IceTInt)uVar4;
  }
  icetStateSetInteger(0x2c,iVar1);
  icetStateSetInteger(0x2d,1);
  icetStateSetInteger(0x2e,0);
  pcVar3 = getenv("ICET_MAGIC_K");
  if (pcVar3 != (char *)0x0) {
    iVar1 = atoi(pcVar3);
    if (1 < iVar1) goto LAB_001098e7;
    icetRaiseDiagnostic("Environment varible ICET_MAGIC_K must be set to an integer greater than 1."
                        ,0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                        ,0xa6);
  }
  iVar1 = 8;
LAB_001098e7:
  icetStateSetInteger(0x40,iVar1);
  pcVar3 = getenv("ICET_MAX_IMAGE_SPLIT");
  iVar1 = 0x200;
  if (pcVar3 != (char *)0x0) {
    iVar1 = atoi(pcVar3);
    if (iVar1 < 1) {
      icetRaiseDiagnostic("Environment variable ICET_MAX_IMAGE_SPLIT must be set to an integer greater than 0."
                          ,0xfffffffa,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                          ,0xb4);
      iVar1 = 0x200;
    }
  }
  icetStateSetInteger(0x41,iVar1);
  icetStateSetPointer(0x60,(IceTVoid *)0x0);
  icetStateSetPointer(0x61,(IceTVoid *)0x0);
  icetEnable(0x141);
  icetDisable(0x142);
  icetDisable(0x143);
  icetEnable(0x144);
  icetEnable(0x145);
  icetEnable(0x146);
  icetStateSetBoolean(0x80,'\0');
  icetStateSetBoolean(0x92,'\0');
  icetStateSetInteger(0x8c,-1);
  icetStateSetInteger(0x8d,0);
  icetStateSetInteger(0x8e,0);
  icetStateResetTiming();
  return;
}

Assistant:

void icetStateSetDefaults(void)
{
    IceTInt *int_array;
    int i;
    int comm_size, comm_rank;

    icetDiagnostics(ICET_DIAG_ALL_NODES | ICET_DIAG_WARNINGS);

    comm_size = icetCommSize();
    comm_rank = icetCommRank();
    icetStateSetInteger(ICET_RANK, comm_rank);
    icetStateSetInteger(ICET_NUM_PROCESSES, comm_size);
    /* icetStateSetInteger(ICET_ABSOLUTE_FAR_DEPTH, 1); */
  /*icetStateSetInteger(ICET_ABSOLUTE_FAR_DEPTH, 0xFFFFFFFF);*/
    icetStateSetFloatv(ICET_BACKGROUND_COLOR, 4, black);
    icetStateSetInteger(ICET_BACKGROUND_COLOR_WORD, 0);
    icetStateSetInteger(ICET_COLOR_FORMAT, ICET_IMAGE_COLOR_RGBA_UBYTE);
    icetStateSetInteger(ICET_DEPTH_FORMAT, ICET_IMAGE_DEPTH_FLOAT);

    icetResetTiles();
    icetStateSetIntegerv(ICET_DISPLAY_NODES, 0, NULL);

    icetStateSetDoublev(ICET_GEOMETRY_BOUNDS, 0, NULL);
    icetStateSetInteger(ICET_NUM_BOUNDING_VERTS, 0);
    icetStateSetInteger(ICET_STRATEGY, ICET_STRATEGY_UNDEFINED);
    icetSingleImageStrategy(ICET_SINGLE_IMAGE_STRATEGY_AUTOMATIC);
    icetCompositeMode(ICET_COMPOSITE_MODE_Z_BUFFER);
    int_array = icetStateAllocateInteger(ICET_COMPOSITE_ORDER, comm_size);
    for (i = 0; i < comm_size; i++) {
        int_array[i] = i;
    }
    int_array = icetStateAllocateInteger(ICET_PROCESS_ORDERS, comm_size);
    for (i = 0; i < comm_size; i++) {
        int_array[i] = i;
    }

    icetStateSetInteger(ICET_DATA_REPLICATION_GROUP, comm_rank);
    icetStateSetInteger(ICET_DATA_REPLICATION_GROUP_SIZE, 1);
    icetStateSetInteger(ICET_FRAME_COUNT, 0);

    if (getenv("ICET_MAGIC_K") != NULL) {
        IceTInt magic_k = atoi(getenv("ICET_MAGIC_K"));
        if (magic_k > 1) {
            icetStateSetInteger(ICET_MAGIC_K, magic_k);
        } else {
            icetRaiseError("Environment varible ICET_MAGIC_K must be set"
                           " to an integer greater than 1.",
                           ICET_INVALID_VALUE);
            icetStateSetInteger(ICET_MAGIC_K, ICET_MAGIC_K_DEFAULT);
        }
    } else {
        icetStateSetInteger(ICET_MAGIC_K, ICET_MAGIC_K_DEFAULT);
    }

    if (getenv("ICET_MAX_IMAGE_SPLIT") != NULL) {
        IceTInt max_image_split = atoi(getenv("ICET_MAX_IMAGE_SPLIT"));
        if (max_image_split > 0) {
            icetStateSetInteger(ICET_MAX_IMAGE_SPLIT, max_image_split);
        } else {
            icetRaiseError("Environment variable ICET_MAX_IMAGE_SPLIT must be"
                           " set to an integer greater than 0.",
                           ICET_INVALID_VALUE);
            icetStateSetInteger(ICET_MAX_IMAGE_SPLIT,
                                ICET_MAX_IMAGE_SPLIT_DEFAULT);
        }
    } else {
        icetStateSetInteger(ICET_MAX_IMAGE_SPLIT, ICET_MAX_IMAGE_SPLIT_DEFAULT);
    }

    icetStateSetPointer(ICET_DRAW_FUNCTION, NULL);
    icetStateSetPointer(ICET_RENDER_LAYER_DESTRUCTOR, NULL);

    icetEnable(ICET_FLOATING_VIEWPORT);
    icetDisable(ICET_ORDERED_COMPOSITE);
    icetDisable(ICET_CORRECT_COLORED_BACKGROUND);
    icetEnable(ICET_COMPOSITE_ONE_BUFFER);
    icetEnable(ICET_INTERLACE_IMAGES);
    icetEnable(ICET_COLLECT_IMAGES);

    icetStateSetBoolean(ICET_IS_DRAWING_FRAME, 0);
    icetStateSetBoolean(ICET_RENDER_BUFFER_SIZE, 0);

    icetStateSetInteger(ICET_VALID_PIXELS_TILE, -1);
    icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, 0);
    icetStateSetInteger(ICET_VALID_PIXELS_NUM, 0);

    icetStateResetTiming();
}